

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.hpp
# Opt level: O0

void __thiscall BCL::error::~error(error *this)

{
  error *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

error(const std::string& what_arg) : what_arg_(what_arg) {}